

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O0

uint8_t * apx_vm_parse_uint32_by_variant
                    (uint8_t *begin,uint8_t *end,uint8_t variant,uint32_t *number)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t unpack_size;
  uint8_t *next;
  uint32_t *number_local;
  uint8_t variant_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  uVar1 = apx_vm_variant_to_size(variant);
  if (((uint8_t)uVar1 == '\0') || (end < begin + (int)(uVar1 & 0xff))) {
    begin_local = (uint8_t *)0x0;
  }
  else {
    uVar2 = unpackLE(begin,(uint8_t)uVar1);
    *number = uVar2;
    begin_local = begin + (int)(uVar1 & 0xff);
  }
  return begin_local;
}

Assistant:

uint8_t const* apx_vm_parse_uint32_by_variant(uint8_t const* begin, uint8_t const* end, uint8_t variant, uint32_t* number)
{
   uint8_t const* next = begin;
   uint8_t const unpack_size = (uint8_t)apx_vm_variant_to_size(variant);
   if ((unpack_size == 0) || (next + unpack_size) > end)
   {
      return NULL;
   }
   *number = (uint32_t)unpackLE(next, unpack_size);
   return next + unpack_size;
}